

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

void __thiscall hta::Metric::insert(Metric *this,Row row)

{
  long lVar1;
  Value VVar2;
  Value VVar3;
  Value VVar4;
  uint64_t uVar5;
  Value VVar6;
  rep rVar7;
  Duration DVar8;
  duration args_5;
  Row row_00;
  Level *pLVar9;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> args_3;
  long lVar10;
  Duration interval;
  
  DVar8 = row.interval.__r;
  lVar10 = (this->interval_factor_).factor_;
  interval.__r = lVar10 * DVar8.__r;
  if (SEXT816(interval.__r) != SEXT816(lVar10) * SEXT816(DVar8.__r)) {
    throw_exception<hta::Exception,char_const*>("integer overflow during interval multiplication");
  }
  if ((this->interval_max_).__r < interval.__r) {
    (*((this->storage_metric_)._M_t.
       super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
       super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
       super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[3])();
    return;
  }
  pLVar9 = get_level(this,interval);
  (*((this->storage_metric_)._M_t.
     super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
     super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
     super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[3])();
  args_3.__d.__r =
       (duration)
       (pLVar9->time_current).
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  args_5.__r = (rep)row.time.
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r;
  if (args_3.__d.__r == (duration)0x0) {
    (pLVar9->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = args_5.__r;
    args_3.__d.__r = (duration)(duration)args_5.__r;
  }
  else if (args_3.__d.__r != (duration)args_5.__r) {
    throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("inconsistent level time for interval ",
               (duration<long,_std::ratio<1L,_1000000000L>_>)interval.__r," time_current: ",
               (time_point)args_3.__d.__r," row.time: ",(time_point)args_5.__r);
  }
  lVar10 = (long)args_3.__d.__r + interval.__r;
  if (lVar10 < 0) {
    __assert_fail("time.time_since_epoch().count() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                  ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
  }
  lVar10 = lVar10 - lVar10 % interval.__r;
  lVar1 = (long)args_3.__d.__r + DVar8.__r;
  if (lVar1 < lVar10) {
    if (DVar8.__r < 0) {
LAB_001696f5:
      __assert_fail("ta.time >= time_current",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/level.hpp"
                    ,0x39,"void hta::Level::advance(TimeAggregate)");
    }
    Aggregate::operator+=(&pLVar9->aggregate,row.aggregate);
    (pLVar9->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = lVar1;
  }
  else {
    if (lVar1 != lVar10) {
      __assert_fail("row.end_time() == level_time_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                    ,0x24c,"void hta::Metric::insert(Row)");
    }
    if (lVar10 < (long)args_3.__d.__r) goto LAB_001696f5;
    Aggregate::operator+=(&pLVar9->aggregate,row.aggregate);
    (pLVar9->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = lVar10;
    VVar2 = (pLVar9->aggregate).minimum;
    VVar3 = (pLVar9->aggregate).maximum;
    VVar4 = (pLVar9->aggregate).sum;
    uVar5 = (pLVar9->aggregate).count;
    VVar6 = (pLVar9->aggregate).integral;
    rVar7 = (pLVar9->aggregate).active_time.__r;
    row_00.time.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._0_4_ = (int)(lVar10 - interval.__r);
    row_00.interval.__r = interval.__r;
    row_00.time.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._4_4_ = (int)((ulong)(lVar10 - interval.__r) >> 0x20);
    row_00.aggregate.minimum._0_4_ = SUB84(VVar2,0);
    row_00.aggregate.minimum._4_4_ = (int)((ulong)VVar2 >> 0x20);
    row_00.aggregate.maximum._0_4_ = SUB84(VVar3,0);
    row_00.aggregate.maximum._4_4_ = (int)((ulong)VVar3 >> 0x20);
    row_00.aggregate.sum._0_4_ = SUB84(VVar4,0);
    row_00.aggregate.sum._4_4_ = (int)((ulong)VVar4 >> 0x20);
    row_00.aggregate.count._0_4_ = (int)uVar5;
    row_00.aggregate.count._4_4_ = (int)(uVar5 >> 0x20);
    row_00.aggregate.integral._0_4_ = SUB84(VVar6,0);
    row_00.aggregate.integral._4_4_ = (int)((ulong)VVar6 >> 0x20);
    row_00.aggregate.active_time.__r._0_4_ = (int)rVar7;
    row_00.aggregate.active_time.__r._4_4_ = (int)((ulong)rVar7 >> 0x20);
    insert(this,row_00);
    (pLVar9->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = lVar10;
    (pLVar9->aggregate).minimum = INFINITY;
    (pLVar9->aggregate).maximum = -INFINITY;
    (pLVar9->aggregate).sum = 0.0;
    (pLVar9->aggregate).count = 0;
    (pLVar9->aggregate).integral = 0.0;
    (pLVar9->aggregate).active_time.__r = 0;
  }
  return;
}

Assistant:

void Metric::insert(Row row)
{
    const auto interval = row.interval * interval_factor_;
    if (interval > interval_max_)
    {
        // write this but don't do anything else!
        storage_metric_->insert(row);
        return;
    }
    auto& level = get_level(interval);
    // We must do this after get_level, otherwise it confuses the level restore
    storage_metric_->insert(row);
    if (!level.time_current)
    {
        level.time_current = row.time;
    }
    else if (level.time_current != row.time)
    {
        throw_exception("inconsistent level time for interval ", interval,
                        " time_current: ", level.time_current, " row.time: ", row.time);
    }
    auto level_time_end = interval_end(level.time_current, interval);
    if (row.end_time() >= level_time_end)
    {
        // the new row from below completes the interval at current level
        // Small intervals should never cross through multiple larger ones
        assert(row.end_time() == level_time_end);
        // Close the interval and make a new one
        level.advance({ level_time_end, row.aggregate });

        auto level_time_begin = level_time_end - interval;

        // Inform higher levels of this new closed level
        insert({ interval, level_time_begin, level.aggregate });

        // reset the interval at current level
        level = Level(level_time_end);
        return;
    }

    level.advance({ row.end_time(), row.aggregate });
}